

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O1

void chacha20_encrypt(chacha20 *ctx,uchar *blk,int len)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  if (len != 0) {
    do {
      if (0x3f < ctx->currentIndex) {
        chacha20_round(ctx);
      }
      iVar1 = ctx->currentIndex;
      iVar2 = len;
      if (iVar1 < 0x40) {
        do {
          ctx->currentIndex = iVar1 + 1;
          *blk = *blk ^ ctx->current[iVar1];
          blk = blk + 1;
          len = iVar2 + -1;
          iVar1 = ctx->currentIndex;
          if (0x3f < iVar1) break;
          bVar3 = iVar2 != 1;
          iVar2 = len;
        } while (bVar3);
      }
    } while (len != 0);
  }
  return;
}

Assistant:

static void chacha20_encrypt(struct chacha20 *ctx, unsigned char *blk, int len)
{
    while (len) {
        /* If we don't have any state left, then cycle to the next */
        if (ctx->currentIndex >= 64) {
            chacha20_round(ctx);
        }

        /* Do the xor while there's some state left and some plaintext left */
        while (ctx->currentIndex < 64 && len) {
            *blk++ ^= ctx->current[ctx->currentIndex++];
            --len;
        }
    }
}